

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_api.hpp
# Opt level: O0

DataBlobSourceDescription * __thiscall
hrgls::datablob::DataBlobSource::GetInfo
          (DataBlobSourceDescription *__return_storage_ptr__,DataBlobSource *this)

{
  DataBlobSource_private *pDVar1;
  int iVar2;
  mapped_type *pmVar3;
  allocator local_91;
  string local_90 [32];
  key_type local_70;
  char *local_68;
  char *name;
  key_type local_58 [3];
  undefined8 local_40;
  hrgls_APIDataBlobSourceInfo info;
  DataBlobSourceDescription ret;
  DataBlobSource *this_local;
  
  ret._24_8_ = this;
  DataBlobSourceDescription::DataBlobSourceDescription((DataBlobSourceDescription *)&info);
  if ((this->m_private != (DataBlobSource_private *)0x0) &&
     (this->m_private->m_stream != (hrgls_DataBlobSource)0x0)) {
    iVar2 = hrgls_DataBlobSourceGetInfo(this->m_private->m_stream,&local_40);
    pDVar1 = this->m_private;
    local_58[0]._M_thread = (native_handle_type)std::this_thread::get_id();
    pmVar3 = std::
             map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
             ::operator[](&pDVar1->m_status,local_58);
    *pmVar3 = iVar2;
    if (iVar2 != 0) {
      DataBlobSourceDescription::DataBlobSourceDescription(__return_storage_ptr__);
      goto LAB_00107450;
    }
    iVar2 = hrgls_APIDataBlobSourceGetName(local_40,&local_68);
    pDVar1 = this->m_private;
    local_70._M_thread = (native_handle_type)std::this_thread::get_id();
    pmVar3 = std::
             map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
             ::operator[](&pDVar1->m_status,&local_70);
    *pmVar3 = iVar2;
    if (iVar2 != 0) {
      DataBlobSourceDescription::DataBlobSourceDescription(__return_storage_ptr__);
      goto LAB_00107450;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,local_68,&local_91);
    DataBlobSourceDescription::Name((DataBlobSourceDescription *)&info,(string *)local_90);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
  }
  DataBlobSourceDescription::DataBlobSourceDescription
            (__return_storage_ptr__,(DataBlobSourceDescription *)&info);
LAB_00107450:
  name._4_4_ = 1;
  DataBlobSourceDescription::~DataBlobSourceDescription((DataBlobSourceDescription *)&info);
  return __return_storage_ptr__;
}

Assistant:

DataBlobSourceDescription DataBlobSource::GetInfo()
    {
      DataBlobSourceDescription ret;
      if (m_private && m_private->m_stream) {

        hrgls_APIDataBlobSourceInfo info;
        if (hrgls_STATUS_OKAY !=
            (m_private->m_status[std::this_thread::get_id()] = hrgls_DataBlobSourceGetInfo(m_private->m_stream, &info))) {
          return DataBlobSourceDescription();
        }

        // Get and fill in the name.
        const char *name;
        if (hrgls_STATUS_OKAY !=
          (m_private->m_status[std::this_thread::get_id()] = hrgls_APIDataBlobSourceGetName(info, &name))) {
          return DataBlobSourceDescription();
        }
        ret.Name(name);
      }
      return ret;
    }